

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::MatrixWrapper<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_-1,_1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,__1,_1,_true,_true>
                  *this,MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_> *xpr,Index i)

{
  long rows;
  
  rows = (xpr->m_expression->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).
         m_storage.m_rows;
  MapBase<Eigen::Block<const_Eigen::MatrixWrapper<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_-1,_1,_true>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::MatrixWrapper<Eigen::Array<double,__1,_1,_0,__1,_1>_>,__1,_1,_true>,_0>
            ,(xpr->m_expression->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_data + rows * i,rows,1);
  (this->m_xpr).m_expression = xpr->m_expression;
  (this->m_startRow).m_value = 0;
  variable_if_dynamic<long,_0>::variable_if_dynamic
            ((variable_if_dynamic<long,_0> *)&this->field_0x28,i);
  this->m_outerStride =
       (((this->m_xpr).m_expression)->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>)
       .m_storage.m_rows;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }